

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int inflateEnd(z_streamp strm)

{
  int iVar1;
  internal_state *piVar2;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    piVar2 = strm->state;
    if (*(voidpf *)&piVar2->method != (voidpf)0x0) {
      (*strm->zfree)(strm->opaque,*(voidpf *)&piVar2->method);
      piVar2 = strm->state;
    }
    (*strm->zfree)(strm->opaque,piVar2);
    strm->state = (internal_state *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateEnd(z_streamp strm) {
    struct inflate_state FAR *state;
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (state->window != Z_NULL) ZFREE(strm, state->window);
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}